

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bijectionmap.h
# Opt level: O3

iterator __thiscall
Common::
BijectionMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>
::insert(BijectionMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>
         *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,KeywordID *val
        )

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *this_00;
  map<ICM::Keyword::KeywordID,_unsigned_long,_std::less<ICM::Keyword::KeywordID>,_std::allocator<std::pair<const_ICM::Keyword::KeywordID,_unsigned_long>_>_>
  *map;
  pointer this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t *psVar2;
  pointer pcVar3;
  mapped_type mVar4;
  const_iterator cVar5;
  size_t sVar6;
  mapped_type *pmVar7;
  size_t sVar8;
  iterator iVar9;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>
  local_58;
  
  this_00 = &this->keymap;
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ::find(&this_00->_M_t,key);
  if (((_Rb_tree_header *)cVar5._M_node == &(this->keymap)._M_t._M_impl.super__Rb_tree_header) ||
     (sVar8 = ((long)(this->data).
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->data).
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333,
     *(size_t *)(cVar5._M_node + 2) == sVar8)) {
    map = &this->valmap;
    sVar6 = _find<ICM::Keyword::KeywordID>(this,map,val);
    sVar8 = ((long)(this->data).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->data).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    if (sVar6 == sVar8) {
      psVar2 = (this->destroyable).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Deque_impl_data._M_start._M_cur;
      if ((this->destroyable).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur == psVar2) {
        mVar4 = this->currcount;
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::operator[](this_00,key);
        *pmVar7 = mVar4;
        mVar4 = this->currcount;
        pmVar7 = std::
                 map<ICM::Keyword::KeywordID,_unsigned_long,_std::less<ICM::Keyword::KeywordID>,_std::allocator<std::pair<const_ICM::Keyword::KeywordID,_unsigned_long>_>_>
                 ::operator[](map,val);
        *pmVar7 = mVar4;
        paVar1 = &local_58.first.field_2;
        pcVar3 = (key->_M_dataplus)._M_p;
        local_58.first._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,pcVar3,pcVar3 + key->_M_string_length);
        local_58.second = *val;
        std::
        vector<std::pair<std::__cxx11::string,ICM::Keyword::KeywordID>,std::allocator<std::pair<std::__cxx11::string,ICM::Keyword::KeywordID>>>
        ::emplace_back<std::pair<std::__cxx11::string,ICM::Keyword::KeywordID>>
                  ((vector<std::pair<std::__cxx11::string,ICM::Keyword::KeywordID>,std::allocator<std::pair<std::__cxx11::string,ICM::Keyword::KeywordID>>>
                    *)&this->data,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58.first._M_dataplus._M_p != paVar1) {
          operator_delete(local_58.first._M_dataplus._M_p,
                          local_58.first.field_2._M_allocated_capacity + 1);
        }
        sVar8 = this->currcount;
        this->currcount = sVar8 + 1;
      }
      else {
        sVar8 = *psVar2;
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::operator[](this_00,key);
        *pmVar7 = sVar8;
        pmVar7 = std::
                 map<ICM::Keyword::KeywordID,_unsigned_long,_std::less<ICM::Keyword::KeywordID>,_std::allocator<std::pair<const_ICM::Keyword::KeywordID,_unsigned_long>_>_>
                 ::operator[](map,val);
        *pmVar7 = sVar8;
        paVar1 = &local_58.first.field_2;
        pcVar3 = (key->_M_dataplus)._M_p;
        local_58.first._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,pcVar3,pcVar3 + key->_M_string_length);
        local_58.second = *val;
        this_01 = (this->data).
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + sVar8;
        std::__cxx11::string::operator=((string *)this_01,(string *)&local_58);
        this_01->second = local_58.second;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58.first._M_dataplus._M_p != paVar1) {
          operator_delete(local_58.first._M_dataplus._M_p,
                          local_58.first.field_2._M_allocated_capacity + 1);
        }
        std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_front(&this->destroyable);
      }
    }
  }
  iVar9.count = sVar8;
  iVar9.data = this;
  return iVar9;
}

Assistant:

iterator insert(const _KTy &key, const _VTy &val) {
		if (findKey(key) != size() || findValue(val) != size()) {
			return end();
		}

		iterator result(this);
		if (destroyable.empty()) {
			keymap[key] = currcount;
			valmap[val] = currcount;
			data.push_back(std::make_pair(key, val));
			result = iterator(this, currcount);
			currcount++;
		}
		else {
			size_t id = destroyable.front();
			keymap[key] = id;
			valmap[val] = id;
			data[id] = std::make_pair(key, val);
			result = iterator(this, id);
			destroyable.pop_front();
		}
		return result;
	}